

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void load_buffer_16xn_avx2
               (int16_t *input,__m256i *out,int stride,int height,int outstride,int flipud,
               int fliplr)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m256i alVar3;
  __m256i alVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  __m256i *palVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  undefined8 local_840 [2];
  undefined8 auStack_830 [261];
  
  auVar8 = _DAT_004c1b00;
  uVar12 = 0;
  if (0 < height) {
    uVar12 = (ulong)(uint)height;
  }
  if (flipud == 0) {
    for (lVar11 = 0; uVar12 * 0x20 != lVar11; lVar11 = lVar11 + 0x20) {
      uVar5 = *(undefined8 *)(input + 4);
      uVar6 = *(undefined8 *)(input + 8);
      uVar7 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)((long)local_840 + lVar11) = *(undefined8 *)input;
      *(undefined8 *)((long)local_840 + lVar11 + 8) = uVar5;
      *(undefined8 *)((long)auStack_830 + lVar11) = uVar6;
      *(undefined8 *)((long)auStack_830 + lVar11 + 8) = uVar7;
      input = input + stride;
    }
  }
  else {
    iVar10 = height + -1;
    while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
      uVar5 = *(undefined8 *)(input + 4);
      uVar6 = *(undefined8 *)(input + 8);
      uVar7 = *(undefined8 *)(input + 0xc);
      lVar11 = (long)iVar10;
      local_840[lVar11 * 4] = *(undefined8 *)input;
      local_840[lVar11 * 4 + 1] = uVar5;
      auStack_830[lVar11 * 4] = uVar6;
      auStack_830[lVar11 * 4 + 1] = uVar7;
      iVar10 = iVar10 + -1;
      input = input + stride;
    }
  }
  uVar12 = 0;
  if (0 < height) {
    uVar12 = (ulong)(uint)height;
  }
  palVar9 = out + 1;
  if (fliplr == 0) {
    for (lVar11 = 0; uVar12 * 0x20 != lVar11; lVar11 = lVar11 + 0x20) {
      alVar3 = (__m256i)vpmovsxwd_avx2(*(undefined1 (*) [16])((long)local_840 + lVar11));
      alVar4 = (__m256i)vpmovsxwd_avx2(*(undefined1 (*) [16])((long)auStack_830 + lVar11));
      palVar9[-1] = alVar3;
      *palVar9 = alVar4;
      palVar9 = palVar9 + outstride;
    }
  }
  else {
    for (lVar11 = 0; uVar12 * 0x20 != lVar11; lVar11 = lVar11 + 0x20) {
      auVar1 = *(undefined1 (*) [16])((long)auStack_830 + lVar11);
      auVar2 = vpshufb_avx(*(undefined1 (*) [16])((long)local_840 + lVar11),auVar8);
      alVar3 = (__m256i)vpmovsxwd_avx2(auVar2);
      *palVar9 = alVar3;
      auVar1 = vpshufb_avx(auVar1,auVar8);
      alVar3 = (__m256i)vpmovsxwd_avx2(auVar1);
      palVar9[-1] = alVar3;
      palVar9 = palVar9 + outstride;
    }
  }
  return;
}

Assistant:

static inline void load_buffer_16xn_avx2(const int16_t *input, __m256i *out,
                                         int stride, int height, int outstride,
                                         int flipud, int fliplr) {
  __m256i out1[64];
  if (!flipud) {
    for (int i = 0; i < height; i++) {
      out1[i] = _mm256_loadu_si256((const __m256i *)(input + i * stride));
    }
  } else {
    for (int i = 0; i < height; i++) {
      out1[(height - 1) - i] =
          _mm256_loadu_si256((const __m256i *)(input + i * stride));
    }
  }
  if (!fliplr) {
    for (int i = 0; i < height; i++) {
      out[i * outstride] =
          _mm256_cvtepi16_epi32(_mm256_castsi256_si128(out1[i]));
      out[i * outstride + 1] =
          _mm256_cvtepi16_epi32(_mm256_extractf128_si256(out1[i], 1));
    }
  } else {
    for (int i = 0; i < height; i++) {
      out[i * outstride + 1] = _mm256_cvtepi16_epi32(
          mm_reverse_epi16(_mm256_castsi256_si128(out1[i])));
      out[i * outstride + 0] = _mm256_cvtepi16_epi32(
          mm_reverse_epi16(_mm256_extractf128_si256(out1[i], 1)));
    }
  }
}